

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aco_solver.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  initializer_list<args::EitherFlag> in;
  initializer_list<args::EitherFlag> in_00;
  initializer_list<args::EitherFlag> in_01;
  initializer_list<args::EitherFlag> in_02;
  initializer_list<args::EitherFlag> in_03;
  initializer_list<args::EitherFlag> in_04;
  initializer_list<args::EitherFlag> in_05;
  initializer_list<args::EitherFlag> in_06;
  initializer_list<args::EitherFlag> in_07;
  initializer_list<args::EitherFlag> in_08;
  initializer_list<args::EitherFlag> in_09;
  initializer_list<args::EitherFlag> in_10;
  initializer_list<args::EitherFlag> in_11;
  initializer_list<args::EitherFlag> in_12;
  initializer_list<args::EitherFlag> in_13;
  initializer_list<args::EitherFlag> in_14;
  initializer_list<args::EitherFlag> in_15;
  initializer_list<args::EitherFlag> in_16;
  initializer_list<args::EitherFlag> in_17;
  initializer_list<double> __l;
  initializer_list<double> __l_00;
  initializer_list<double> __l_01;
  bool bVar1;
  int iVar2;
  int iVar3;
  time_t tVar4;
  double *pdVar5;
  uint *puVar6;
  int *piVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  char *__path;
  ostream *poVar9;
  void *pvVar10;
  void *pvVar11;
  ostream *poVar12;
  ostream *poVar13;
  ostream *poVar14;
  ACS *this;
  vector<double,_std::allocator<double>_> *Zmin_00;
  size_type sVar15;
  ostream *__x;
  long *plVar16;
  ACO *aco;
  int i;
  vector<imrt::Volume,_std::allocator<imrt::Volume>_> volumes;
  Collimator collimator;
  vector<double,_std::allocator<double>_> Zmax;
  vector<double,_std::allocator<double>_> Zmin;
  vector<double,_std::allocator<double>_> w;
  Help *anon_var_0;
  ParseError *e;
  ValidationError *e_1;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _path;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _file2;
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  _file;
  Flag _plot;
  ValueFlag<int,_args::ValueReader<int>_> _step_intensity;
  ValueFlag<int,_args::ValueReader<int>_> _max_intensity;
  ValueFlag<int,_args::ValueReader<int>_> _initial_intensity;
  ValueFlag<int,_args::ValueReader<int>_> _open_apertures;
  ValueFlag<int,_args::ValueReader<int>_> _max_apertures;
  ValueFlag<int,_args::ValueReader<int>_> _seed;
  ValueFlag<int,_args::ValueReader<int>_> _maxtime;
  ValueFlag<int,_args::ValueReader<int>_> _maxiter;
  ValueFlag<double,_args::ValueReader<double>_> _beta;
  ValueFlag<double,_args::ValueReader<double>_> _alpha;
  ValueFlag<int,_args::ValueReader<int>_> _maxratio;
  ValueFlag<int,_args::ValueReader<int>_> _maxdelta;
  ValueFlag<int,_args::ValueReader<int>_> _vsize;
  ValueFlag<int,_args::ValueReader<int>_> _bsize;
  HelpFlag help;
  ArgumentParser parser;
  int seed;
  string path;
  string file2;
  string file;
  int step_intensity;
  int max_intensity;
  int initial_intensity;
  double maxratio;
  double maxdelta;
  double beta;
  double alpha;
  int open_apertures;
  int max_apertures;
  int maxtime;
  int maxiter;
  int bsize;
  int vsize;
  int in_stack_ffffffffffffcaec;
  undefined4 in_stack_ffffffffffffcaf0;
  int iVar17;
  undefined4 in_stack_ffffffffffffcaf4;
  undefined4 in_stack_ffffffffffffcaf8;
  undefined4 in_stack_ffffffffffffcafc;
  undefined1 extraError_;
  undefined4 in_stack_ffffffffffffcb00;
  int iVar18;
  undefined4 in_stack_ffffffffffffcb04;
  undefined4 in_stack_ffffffffffffcb08;
  undefined4 in_stack_ffffffffffffcb0c;
  Matcher *in_stack_ffffffffffffcb10;
  Group *in_stack_ffffffffffffcb18;
  Matcher *in_stack_ffffffffffffcb20;
  int in_stack_ffffffffffffcb28;
  int in_stack_ffffffffffffcb2c;
  Collimator *in_stack_ffffffffffffcb30;
  undefined8 in_stack_ffffffffffffcb38;
  char **in_stack_ffffffffffffcb50;
  undefined8 in_stack_ffffffffffffcb58;
  ArgumentParser *in_stack_ffffffffffffcb60;
  ostream *in_stack_ffffffffffffcb98;
  undefined4 in_stack_ffffffffffffcba0;
  int in_stack_ffffffffffffcba4;
  int iVar19;
  undefined4 in_stack_ffffffffffffcbb8;
  string *in_stack_ffffffffffffcbc0;
  string *in_stack_ffffffffffffcbc8;
  int max_apertures_00;
  ArgumentParser *in_stack_ffffffffffffcbd0;
  int max_intensity_00;
  int initial_intensity_00;
  int step_intensity_00;
  int _n_ants;
  Collimator *in_stack_ffffffffffffce10;
  string *in_stack_ffffffffffffce18;
  int in_stack_ffffffffffffce44;
  string *in_stack_ffffffffffffce48;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_ffffffffffffcec0;
  string *in_stack_ffffffffffffcec8;
  Collimator *in_stack_ffffffffffffced0;
  undefined8 **local_3018;
  undefined8 **local_2fe8;
  undefined8 **local_2fb8;
  undefined8 **local_2f88;
  undefined8 **local_2f60;
  undefined8 **local_2f40;
  undefined8 **local_2f20;
  undefined8 **local_2f00;
  undefined8 **local_2ee0;
  undefined8 **local_2ec0;
  undefined8 **local_2ea0;
  undefined8 **local_2e80;
  undefined8 **local_2e60;
  undefined8 **local_2e40;
  undefined8 **local_2e20;
  undefined8 **local_2e00;
  undefined8 **local_2de0;
  undefined8 **local_2dc0;
  undefined8 **local_2da0;
  int local_2d04;
  string local_2d00 [32];
  vector<imrt::Volume,_std::allocator<imrt::Volume>_> local_2ce0;
  string local_2cc8 [80];
  string local_2c78 [32];
  Collimator local_2c58;
  undefined8 local_2a98;
  undefined8 uStack_2a90;
  undefined8 local_2a88;
  undefined8 *local_2a78;
  undefined8 local_2a70;
  undefined8 local_2a48;
  undefined8 uStack_2a40;
  undefined8 local_2a38;
  undefined8 *local_2a28;
  undefined8 local_2a20;
  undefined8 local_29f8;
  undefined8 uStack_29f0;
  undefined8 local_29e8;
  undefined8 *local_29e0;
  undefined8 local_29d8;
  undefined4 local_29a4;
  string local_2998 [32];
  undefined1 **local_2978;
  undefined8 *local_2970 [5];
  undefined1 **local_2948;
  undefined8 local_2940;
  allocator local_28c1;
  string local_28c0 [39];
  allocator local_2899;
  string local_2898 [32];
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2878;
  string local_2788 [32];
  undefined1 **local_2768;
  undefined8 *local_2760 [5];
  undefined1 **local_2738;
  undefined8 local_2730;
  allocator local_26b1;
  string local_26b0 [39];
  allocator local_2689;
  string local_2688 [32];
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2668;
  string local_2578 [32];
  undefined1 **local_2558;
  undefined8 *local_2550 [5];
  undefined1 **local_2528;
  undefined8 local_2520;
  allocator local_24a1;
  string local_24a0 [39];
  allocator local_2479;
  string local_2478 [32];
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2458;
  undefined1 **local_2368;
  undefined8 *local_2360 [5];
  undefined1 **local_2338;
  undefined8 local_2330;
  allocator local_22b1;
  string local_22b0 [39];
  allocator local_2289;
  string local_2288 [236];
  undefined4 local_219c;
  undefined1 **local_2198;
  undefined8 *local_2190 [5];
  undefined1 **local_2168;
  undefined8 local_2160;
  string local_20e8 [32];
  string local_20c8 [32];
  string local_20a8 [39];
  allocator local_2081;
  string local_2080 [32];
  ValueFlag<int,_args::ValueReader<int>_> local_2060;
  undefined4 local_1f8c;
  undefined1 **local_1f88;
  undefined8 *local_1f80 [5];
  undefined1 **local_1f58;
  undefined8 local_1f50;
  string local_1ed8 [32];
  string local_1eb8 [32];
  string local_1e98 [39];
  allocator local_1e71;
  string local_1e70 [32];
  ValueFlag<int,_args::ValueReader<int>_> local_1e50;
  undefined4 local_1d7c;
  undefined1 **local_1d78;
  undefined8 *local_1d70 [5];
  undefined1 **local_1d48;
  undefined8 local_1d40;
  string local_1cc8 [32];
  string local_1ca8 [32];
  string local_1c88 [39];
  allocator local_1c61;
  string local_1c60 [32];
  ValueFlag<int,_args::ValueReader<int>_> local_1c40;
  undefined4 local_1b6c;
  undefined1 **local_1b68;
  undefined8 *local_1b60 [5];
  undefined1 **local_1b38;
  undefined8 local_1b30;
  string local_1ab8 [32];
  string local_1a98 [32];
  string local_1a78 [39];
  allocator local_1a51;
  string local_1a50 [32];
  ValueFlag<int,_args::ValueReader<int>_> local_1a30;
  undefined4 local_195c;
  undefined1 **local_1958;
  undefined8 *local_1950 [5];
  undefined1 **local_1928;
  undefined8 local_1920;
  string local_18a8 [32];
  string local_1888 [32];
  string local_1868 [39];
  allocator local_1841;
  string local_1840 [32];
  ValueFlag<int,_args::ValueReader<int>_> local_1820;
  undefined4 local_174c;
  undefined1 **local_1748;
  undefined8 *local_1740 [5];
  undefined1 **local_1718;
  undefined8 local_1710;
  string local_1698 [32];
  string local_1678 [32];
  string local_1658 [39];
  allocator local_1631;
  string local_1630 [32];
  ValueFlag<int,_args::ValueReader<int>_> local_1610;
  undefined4 local_153c;
  undefined1 **local_1538;
  undefined8 *local_1530 [5];
  undefined1 **local_1508;
  undefined8 local_1500;
  string local_1488 [32];
  string local_1468 [32];
  string local_1448 [39];
  allocator local_1421;
  string local_1420 [32];
  ValueFlag<int,_args::ValueReader<int>_> local_1400;
  undefined4 local_132c;
  undefined1 **local_1328;
  undefined8 *local_1320 [5];
  undefined1 **local_12f8;
  undefined8 local_12f0;
  string local_1278 [32];
  string local_1258 [32];
  string local_1238 [39];
  allocator local_1211;
  string local_1210 [32];
  ValueFlag<int,_args::ValueReader<int>_> local_11f0;
  undefined8 local_1120;
  undefined1 **local_1118;
  undefined8 *local_1110 [5];
  undefined1 **local_10e8;
  undefined8 local_10e0;
  string local_1068 [32];
  string local_1048 [32];
  string local_1028 [39];
  allocator local_1001;
  string local_1000 [32];
  ValueFlag<double,_args::ValueReader<double>_> local_fe0;
  undefined8 local_f08;
  undefined1 **local_f00;
  undefined8 *local_ef8 [5];
  undefined1 **local_ed0;
  undefined8 local_ec8;
  string local_e50 [32];
  string local_e30 [32];
  string local_e10 [39];
  allocator local_de9;
  string local_de8 [32];
  ValueFlag<double,_args::ValueReader<double>_> local_dc8;
  undefined4 local_cec;
  undefined1 **local_ce8;
  undefined8 *local_ce0 [5];
  undefined1 **local_cb8;
  undefined8 local_cb0;
  string local_c38 [32];
  string local_c18 [32];
  string local_bf8 [39];
  allocator local_bd1;
  string local_bd0 [32];
  ValueFlag<int,_args::ValueReader<int>_> local_bb0;
  undefined4 local_adc;
  undefined1 **local_ad8;
  undefined8 *local_ad0 [5];
  undefined1 **local_aa8;
  undefined8 local_aa0;
  string local_a28 [32];
  string local_a08 [32];
  string local_9e8 [39];
  allocator local_9c1;
  string local_9c0 [32];
  ValueFlag<int,_args::ValueReader<int>_> local_9a0;
  undefined4 local_8cc;
  undefined1 **local_8c8;
  undefined8 *local_8c0 [5];
  undefined1 **local_898;
  undefined8 local_890;
  string local_818 [32];
  string local_7f8 [32];
  string local_7d8 [39];
  allocator local_7b1;
  string local_7b0 [32];
  ValueFlag<int,_args::ValueReader<int>_> local_790;
  undefined4 local_6bc;
  undefined1 **local_6b8;
  undefined8 *local_6b0 [5];
  undefined1 **local_688;
  undefined8 local_680;
  string local_608 [32];
  string local_5e8 [32];
  string local_5c8 [39];
  allocator local_5a1;
  string local_5a0 [32];
  ValueFlag<int,_args::ValueReader<int>_> local_580;
  undefined1 **local_4b0;
  undefined8 *local_4a8 [5];
  undefined1 local_480 [40];
  undefined1 **local_458;
  undefined8 local_450;
  allocator local_3d1;
  string local_3d0 [39];
  allocator local_3a9;
  string local_3a8 [239];
  allocator local_2b9;
  string local_2b8 [39];
  allocator local_291;
  string local_290 [432];
  uint local_e0;
  allocator local_d9;
  string local_d8 [39];
  allocator local_b1;
  string local_b0 [55];
  allocator local_79;
  string local_78 [36];
  int local_54;
  int local_50;
  int local_4c;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_4;
  
  local_4 = 0;
  local_14 = 0x32;
  local_18 = 0x14;
  local_1c = 5000;
  local_20 = 0;
  local_24 = 5;
  local_28 = -1;
  local_30 = 1.0;
  local_38 = 1.0;
  local_40 = 5.0;
  local_48 = 3.0;
  local_4c = 2;
  local_50 = 0x1c;
  local_54 = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"data/testinstance_0_70_140_210_280.txt",&local_79);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"data/test_instance_coordinates.txt",&local_b1);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,".",&local_d9);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  tVar4 = time((time_t *)0x0);
  local_e0 = (uint)tVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_290,"********* IMRT-Solver (ACO solver) *********",&local_291);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2b8,
             "Example.\n./ACO -s ibo_ls --maxiter=400 --maxdelta=8 --maxratio=6 --alpha=0.999 --beta=0.999 --bsize=5 --vsize=20 --max-apertures=4 --seed=0 --open-apertures=1 --initial-intensity=4 --step-intensity=1 --file-dep=data/Equidistantes/equidist00.txt --file-coord=data/Equidistantes/equidist-coord.txt"
             ,&local_2b9);
  args::ArgumentParser::ArgumentParser
            (in_stack_ffffffffffffcbd0,in_stack_ffffffffffffcbc8,in_stack_ffffffffffffcbc0);
  std::__cxx11::string::~string(local_2b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2b9);
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3a8,"help",&local_3a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3d0,"Display this help menu",&local_3d1);
  local_4b0 = (undefined1 **)local_4a8;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0),
             (char)((uint)in_stack_ffffffffffffcaec >> 0x18));
  local_4b0 = (undefined1 **)local_480;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffcb20,(char *)in_stack_ffffffffffffcb18);
  local_458 = (undefined1 **)local_4a8;
  local_450 = 2;
  in._M_array._4_4_ = in_stack_ffffffffffffcb2c;
  in._M_array._0_4_ = in_stack_ffffffffffffcb28;
  in._M_len = (size_type)in_stack_ffffffffffffcb30;
  args::Matcher::Matcher(in_stack_ffffffffffffcb20,in);
  args::HelpFlag::HelpFlag
            ((HelpFlag *)in_stack_ffffffffffffcb10,
             (Group *)CONCAT44(in_stack_ffffffffffffcb0c,in_stack_ffffffffffffcb08),
             (string *)CONCAT44(in_stack_ffffffffffffcb04,in_stack_ffffffffffffcb00),
             (string *)CONCAT44(in_stack_ffffffffffffcafc,in_stack_ffffffffffffcaf8),
             (Matcher *)CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  local_2da0 = &local_458;
  do {
    local_2da0 = local_2da0 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x107f67);
  } while (local_2da0 != local_4a8);
  std::__cxx11::string::~string(local_3d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
  std::__cxx11::string::~string(local_3a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5a0,"int",&local_5a1);
  std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffcb38 >> 0x20));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffcafc,in_stack_ffffffffffffcaf8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffcafc,in_stack_ffffffffffffcaf8),
                 (char *)CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  local_6b8 = (undefined1 **)local_6b0;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffcb20,(char *)in_stack_ffffffffffffcb18);
  local_688 = (undefined1 **)local_6b0;
  local_680 = 1;
  in_00._M_array._4_4_ = in_stack_ffffffffffffcb2c;
  in_00._M_array._0_4_ = in_stack_ffffffffffffcb28;
  in_00._M_len = (size_type)in_stack_ffffffffffffcb30;
  args::Matcher::Matcher(in_stack_ffffffffffffcb20,in_00);
  local_6bc = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)in_stack_ffffffffffffcb30,
             (Group *)CONCAT44(in_stack_ffffffffffffcb2c,in_stack_ffffffffffffcb28),
             (string *)in_stack_ffffffffffffcb20,(string *)in_stack_ffffffffffffcb18,
             in_stack_ffffffffffffcb10,
             (int *)CONCAT44(in_stack_ffffffffffffcb0c,in_stack_ffffffffffffcb08),
             SUB41((uint)in_stack_ffffffffffffcb04 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  local_2dc0 = &local_688;
  do {
    local_2dc0 = local_2dc0 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x108123);
  } while (local_2dc0 != local_6b0);
  std::__cxx11::string::~string(local_5c8);
  std::__cxx11::string::~string(local_5e8);
  std::__cxx11::string::~string(local_608);
  std::__cxx11::string::~string(local_5a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7b0,"int",&local_7b1);
  std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffcb38 >> 0x20));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffcafc,in_stack_ffffffffffffcaf8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffcafc,in_stack_ffffffffffffcaf8),
                 (char *)CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  local_8c8 = (undefined1 **)local_8c0;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffcb20,(char *)in_stack_ffffffffffffcb18);
  local_898 = (undefined1 **)local_8c0;
  local_890 = 1;
  in_01._M_array._4_4_ = in_stack_ffffffffffffcb2c;
  in_01._M_array._0_4_ = in_stack_ffffffffffffcb28;
  in_01._M_len = (size_type)in_stack_ffffffffffffcb30;
  args::Matcher::Matcher(in_stack_ffffffffffffcb20,in_01);
  local_8cc = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)in_stack_ffffffffffffcb30,
             (Group *)CONCAT44(in_stack_ffffffffffffcb2c,in_stack_ffffffffffffcb28),
             (string *)in_stack_ffffffffffffcb20,(string *)in_stack_ffffffffffffcb18,
             in_stack_ffffffffffffcb10,
             (int *)CONCAT44(in_stack_ffffffffffffcb0c,in_stack_ffffffffffffcb08),
             SUB41((uint)in_stack_ffffffffffffcb04 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  local_2de0 = &local_898;
  do {
    local_2de0 = local_2de0 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x1082ec);
  } while (local_2de0 != local_8c0);
  std::__cxx11::string::~string(local_7d8);
  std::__cxx11::string::~string(local_7f8);
  std::__cxx11::string::~string(local_818);
  std::__cxx11::string::~string(local_7b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_9c0,"int",&local_9c1);
  std::__cxx11::to_string((double)CONCAT44(in_stack_ffffffffffffcafc,in_stack_ffffffffffffcaf8));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffcafc,in_stack_ffffffffffffcaf8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffcafc,in_stack_ffffffffffffcaf8),
                 (char *)CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  local_ad8 = (undefined1 **)local_ad0;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffcb20,(char *)in_stack_ffffffffffffcb18);
  local_aa8 = (undefined1 **)local_ad0;
  local_aa0 = 1;
  in_02._M_array._4_4_ = in_stack_ffffffffffffcb2c;
  in_02._M_array._0_4_ = in_stack_ffffffffffffcb28;
  in_02._M_len = (size_type)in_stack_ffffffffffffcb30;
  args::Matcher::Matcher(in_stack_ffffffffffffcb20,in_02);
  local_adc = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)in_stack_ffffffffffffcb30,
             (Group *)CONCAT44(in_stack_ffffffffffffcb2c,in_stack_ffffffffffffcb28),
             (string *)in_stack_ffffffffffffcb20,(string *)in_stack_ffffffffffffcb18,
             in_stack_ffffffffffffcb10,
             (int *)CONCAT44(in_stack_ffffffffffffcb0c,in_stack_ffffffffffffcb08),
             SUB41((uint)in_stack_ffffffffffffcb04 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  local_2e00 = &local_aa8;
  do {
    local_2e00 = local_2e00 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x1084b7);
  } while (local_2e00 != local_ad0);
  std::__cxx11::string::~string(local_9e8);
  std::__cxx11::string::~string(local_a08);
  std::__cxx11::string::~string(local_a28);
  std::__cxx11::string::~string(local_9c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_9c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_bd0,"int",&local_bd1);
  std::__cxx11::to_string((double)CONCAT44(in_stack_ffffffffffffcafc,in_stack_ffffffffffffcaf8));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffcafc,in_stack_ffffffffffffcaf8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffcafc,in_stack_ffffffffffffcaf8),
                 (char *)CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  local_ce8 = (undefined1 **)local_ce0;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffcb20,(char *)in_stack_ffffffffffffcb18);
  local_cb8 = (undefined1 **)local_ce0;
  local_cb0 = 1;
  in_03._M_array._4_4_ = in_stack_ffffffffffffcb2c;
  in_03._M_array._0_4_ = in_stack_ffffffffffffcb28;
  in_03._M_len = (size_type)in_stack_ffffffffffffcb30;
  args::Matcher::Matcher(in_stack_ffffffffffffcb20,in_03);
  local_cec = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)in_stack_ffffffffffffcb30,
             (Group *)CONCAT44(in_stack_ffffffffffffcb2c,in_stack_ffffffffffffcb28),
             (string *)in_stack_ffffffffffffcb20,(string *)in_stack_ffffffffffffcb18,
             in_stack_ffffffffffffcb10,
             (int *)CONCAT44(in_stack_ffffffffffffcb0c,in_stack_ffffffffffffcb08),
             SUB41((uint)in_stack_ffffffffffffcb04 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  local_2e20 = &local_cb8;
  do {
    local_2e20 = local_2e20 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x108682);
  } while (local_2e20 != local_ce0);
  std::__cxx11::string::~string(local_bf8);
  std::__cxx11::string::~string(local_c18);
  std::__cxx11::string::~string(local_c38);
  std::__cxx11::string::~string(local_bd0);
  std::allocator<char>::~allocator((allocator<char> *)&local_bd1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_de8,"double",&local_de9);
  std::__cxx11::to_string((double)CONCAT44(in_stack_ffffffffffffcafc,in_stack_ffffffffffffcaf8));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffcafc,in_stack_ffffffffffffcaf8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffcafc,in_stack_ffffffffffffcaf8),
                 (char *)CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  local_f00 = (undefined1 **)local_ef8;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffcb20,(char *)in_stack_ffffffffffffcb18);
  local_ed0 = (undefined1 **)local_ef8;
  local_ec8 = 1;
  in_04._M_array._4_4_ = in_stack_ffffffffffffcb2c;
  in_04._M_array._0_4_ = in_stack_ffffffffffffcb28;
  in_04._M_len = (size_type)in_stack_ffffffffffffcb30;
  args::Matcher::Matcher(in_stack_ffffffffffffcb20,in_04);
  local_f08 = 0;
  args::ValueFlag<double,_args::ValueReader<double>_>::ValueFlag
            ((ValueFlag<double,_args::ValueReader<double>_> *)in_stack_ffffffffffffcb30,
             (Group *)CONCAT44(in_stack_ffffffffffffcb2c,in_stack_ffffffffffffcb28),
             (string *)in_stack_ffffffffffffcb20,(string *)in_stack_ffffffffffffcb18,
             in_stack_ffffffffffffcb10,
             (double *)CONCAT44(in_stack_ffffffffffffcb0c,in_stack_ffffffffffffcb08),
             SUB41((uint)in_stack_ffffffffffffcb04 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  local_2e40 = &local_ed0;
  do {
    local_2e40 = local_2e40 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x10884e);
  } while (local_2e40 != local_ef8);
  std::__cxx11::string::~string(local_e10);
  std::__cxx11::string::~string(local_e30);
  std::__cxx11::string::~string(local_e50);
  std::__cxx11::string::~string(local_de8);
  std::allocator<char>::~allocator((allocator<char> *)&local_de9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1000,"double",&local_1001);
  std::__cxx11::to_string((double)CONCAT44(in_stack_ffffffffffffcafc,in_stack_ffffffffffffcaf8));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffcafc,in_stack_ffffffffffffcaf8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffcafc,in_stack_ffffffffffffcaf8),
                 (char *)CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  local_1118 = (undefined1 **)local_1110;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffcb20,(char *)in_stack_ffffffffffffcb18);
  local_10e8 = (undefined1 **)local_1110;
  local_10e0 = 1;
  in_05._M_array._4_4_ = in_stack_ffffffffffffcb2c;
  in_05._M_array._0_4_ = in_stack_ffffffffffffcb28;
  in_05._M_len = (size_type)in_stack_ffffffffffffcb30;
  args::Matcher::Matcher(in_stack_ffffffffffffcb20,in_05);
  local_1120 = 0;
  args::ValueFlag<double,_args::ValueReader<double>_>::ValueFlag
            ((ValueFlag<double,_args::ValueReader<double>_> *)in_stack_ffffffffffffcb30,
             (Group *)CONCAT44(in_stack_ffffffffffffcb2c,in_stack_ffffffffffffcb28),
             (string *)in_stack_ffffffffffffcb20,(string *)in_stack_ffffffffffffcb18,
             in_stack_ffffffffffffcb10,
             (double *)CONCAT44(in_stack_ffffffffffffcb0c,in_stack_ffffffffffffcb08),
             SUB41((uint)in_stack_ffffffffffffcb04 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  local_2e60 = &local_10e8;
  do {
    local_2e60 = local_2e60 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x108a1a);
  } while (local_2e60 != local_1110);
  std::__cxx11::string::~string(local_1028);
  std::__cxx11::string::~string(local_1048);
  std::__cxx11::string::~string(local_1068);
  std::__cxx11::string::~string(local_1000);
  std::allocator<char>::~allocator((allocator<char> *)&local_1001);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1210,"int",&local_1211);
  std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffcb38 >> 0x20));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffcafc,in_stack_ffffffffffffcaf8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffcafc,in_stack_ffffffffffffcaf8),
                 (char *)CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  local_1328 = (undefined1 **)local_1320;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffcb20,(char *)in_stack_ffffffffffffcb18);
  local_12f8 = (undefined1 **)local_1320;
  local_12f0 = 1;
  in_06._M_array._4_4_ = in_stack_ffffffffffffcb2c;
  in_06._M_array._0_4_ = in_stack_ffffffffffffcb28;
  in_06._M_len = (size_type)in_stack_ffffffffffffcb30;
  args::Matcher::Matcher(in_stack_ffffffffffffcb20,in_06);
  local_132c = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)in_stack_ffffffffffffcb30,
             (Group *)CONCAT44(in_stack_ffffffffffffcb2c,in_stack_ffffffffffffcb28),
             (string *)in_stack_ffffffffffffcb20,(string *)in_stack_ffffffffffffcb18,
             in_stack_ffffffffffffcb10,
             (int *)CONCAT44(in_stack_ffffffffffffcb0c,in_stack_ffffffffffffcb08),
             SUB41((uint)in_stack_ffffffffffffcb04 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  local_2e80 = &local_12f8;
  do {
    local_2e80 = local_2e80 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x108be3);
  } while (local_2e80 != local_1320);
  std::__cxx11::string::~string(local_1238);
  std::__cxx11::string::~string(local_1258);
  std::__cxx11::string::~string(local_1278);
  std::__cxx11::string::~string(local_1210);
  std::allocator<char>::~allocator((allocator<char> *)&local_1211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1420,"int",&local_1421);
  std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffcb38 >> 0x20));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffcafc,in_stack_ffffffffffffcaf8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffcafc,in_stack_ffffffffffffcaf8),
                 (char *)CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  local_1538 = (undefined1 **)local_1530;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffcb20,(char *)in_stack_ffffffffffffcb18);
  local_1508 = (undefined1 **)local_1530;
  local_1500 = 1;
  in_07._M_array._4_4_ = in_stack_ffffffffffffcb2c;
  in_07._M_array._0_4_ = in_stack_ffffffffffffcb28;
  in_07._M_len = (size_type)in_stack_ffffffffffffcb30;
  args::Matcher::Matcher(in_stack_ffffffffffffcb20,in_07);
  local_153c = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)in_stack_ffffffffffffcb30,
             (Group *)CONCAT44(in_stack_ffffffffffffcb2c,in_stack_ffffffffffffcb28),
             (string *)in_stack_ffffffffffffcb20,(string *)in_stack_ffffffffffffcb18,
             in_stack_ffffffffffffcb10,
             (int *)CONCAT44(in_stack_ffffffffffffcb0c,in_stack_ffffffffffffcb08),
             SUB41((uint)in_stack_ffffffffffffcb04 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  local_2ea0 = &local_1508;
  do {
    local_2ea0 = local_2ea0 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x108dac);
  } while (local_2ea0 != local_1530);
  std::__cxx11::string::~string(local_1448);
  std::__cxx11::string::~string(local_1468);
  std::__cxx11::string::~string(local_1488);
  std::__cxx11::string::~string(local_1420);
  std::allocator<char>::~allocator((allocator<char> *)&local_1421);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1630,"int",&local_1631);
  std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffcb38 >> 0x20));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffcafc,in_stack_ffffffffffffcaf8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffcafc,in_stack_ffffffffffffcaf8),
                 (char *)CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  local_1748 = (undefined1 **)local_1740;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffcb20,(char *)in_stack_ffffffffffffcb18);
  local_1718 = (undefined1 **)local_1740;
  local_1710 = 1;
  in_08._M_array._4_4_ = in_stack_ffffffffffffcb2c;
  in_08._M_array._0_4_ = in_stack_ffffffffffffcb28;
  in_08._M_len = (size_type)in_stack_ffffffffffffcb30;
  args::Matcher::Matcher(in_stack_ffffffffffffcb20,in_08);
  local_174c = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)in_stack_ffffffffffffcb30,
             (Group *)CONCAT44(in_stack_ffffffffffffcb2c,in_stack_ffffffffffffcb28),
             (string *)in_stack_ffffffffffffcb20,(string *)in_stack_ffffffffffffcb18,
             in_stack_ffffffffffffcb10,
             (int *)CONCAT44(in_stack_ffffffffffffcb0c,in_stack_ffffffffffffcb08),
             SUB41((uint)in_stack_ffffffffffffcb04 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  local_2ec0 = &local_1718;
  do {
    local_2ec0 = local_2ec0 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x108f75);
  } while (local_2ec0 != local_1740);
  std::__cxx11::string::~string(local_1658);
  std::__cxx11::string::~string(local_1678);
  std::__cxx11::string::~string(local_1698);
  std::__cxx11::string::~string(local_1630);
  std::allocator<char>::~allocator((allocator<char> *)&local_1631);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1840,"int",&local_1841);
  std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffcb38 >> 0x20));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffcafc,in_stack_ffffffffffffcaf8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffcafc,in_stack_ffffffffffffcaf8),
                 (char *)CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  local_1958 = (undefined1 **)local_1950;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffcb20,(char *)in_stack_ffffffffffffcb18);
  local_1928 = (undefined1 **)local_1950;
  local_1920 = 1;
  in_09._M_array._4_4_ = in_stack_ffffffffffffcb2c;
  in_09._M_array._0_4_ = in_stack_ffffffffffffcb28;
  in_09._M_len = (size_type)in_stack_ffffffffffffcb30;
  args::Matcher::Matcher(in_stack_ffffffffffffcb20,in_09);
  local_195c = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)in_stack_ffffffffffffcb30,
             (Group *)CONCAT44(in_stack_ffffffffffffcb2c,in_stack_ffffffffffffcb28),
             (string *)in_stack_ffffffffffffcb20,(string *)in_stack_ffffffffffffcb18,
             in_stack_ffffffffffffcb10,
             (int *)CONCAT44(in_stack_ffffffffffffcb0c,in_stack_ffffffffffffcb08),
             SUB41((uint)in_stack_ffffffffffffcb04 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  local_2ee0 = &local_1928;
  do {
    local_2ee0 = local_2ee0 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x10913e);
  } while (local_2ee0 != local_1950);
  std::__cxx11::string::~string(local_1868);
  std::__cxx11::string::~string(local_1888);
  std::__cxx11::string::~string(local_18a8);
  std::__cxx11::string::~string(local_1840);
  std::allocator<char>::~allocator((allocator<char> *)&local_1841);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a50,"int",&local_1a51);
  std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffcb38 >> 0x20));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffcafc,in_stack_ffffffffffffcaf8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffcafc,in_stack_ffffffffffffcaf8),
                 (char *)CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  local_1b68 = (undefined1 **)local_1b60;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffcb20,(char *)in_stack_ffffffffffffcb18);
  local_1b38 = (undefined1 **)local_1b60;
  local_1b30 = 1;
  in_10._M_array._4_4_ = in_stack_ffffffffffffcb2c;
  in_10._M_array._0_4_ = in_stack_ffffffffffffcb28;
  in_10._M_len = (size_type)in_stack_ffffffffffffcb30;
  args::Matcher::Matcher(in_stack_ffffffffffffcb20,in_10);
  local_1b6c = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)in_stack_ffffffffffffcb30,
             (Group *)CONCAT44(in_stack_ffffffffffffcb2c,in_stack_ffffffffffffcb28),
             (string *)in_stack_ffffffffffffcb20,(string *)in_stack_ffffffffffffcb18,
             in_stack_ffffffffffffcb10,
             (int *)CONCAT44(in_stack_ffffffffffffcb0c,in_stack_ffffffffffffcb08),
             SUB41((uint)in_stack_ffffffffffffcb04 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  local_2f00 = &local_1b38;
  do {
    local_2f00 = local_2f00 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x109307);
  } while (local_2f00 != local_1b60);
  std::__cxx11::string::~string(local_1a78);
  std::__cxx11::string::~string(local_1a98);
  std::__cxx11::string::~string(local_1ab8);
  std::__cxx11::string::~string(local_1a50);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1c60,"int",&local_1c61);
  std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffcb38 >> 0x20));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffcafc,in_stack_ffffffffffffcaf8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffcafc,in_stack_ffffffffffffcaf8),
                 (char *)CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  local_1d78 = (undefined1 **)local_1d70;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffcb20,(char *)in_stack_ffffffffffffcb18);
  local_1d48 = (undefined1 **)local_1d70;
  local_1d40 = 1;
  in_11._M_array._4_4_ = in_stack_ffffffffffffcb2c;
  in_11._M_array._0_4_ = in_stack_ffffffffffffcb28;
  in_11._M_len = (size_type)in_stack_ffffffffffffcb30;
  args::Matcher::Matcher(in_stack_ffffffffffffcb20,in_11);
  local_1d7c = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)in_stack_ffffffffffffcb30,
             (Group *)CONCAT44(in_stack_ffffffffffffcb2c,in_stack_ffffffffffffcb28),
             (string *)in_stack_ffffffffffffcb20,(string *)in_stack_ffffffffffffcb18,
             in_stack_ffffffffffffcb10,
             (int *)CONCAT44(in_stack_ffffffffffffcb0c,in_stack_ffffffffffffcb08),
             SUB41((uint)in_stack_ffffffffffffcb04 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  local_2f20 = &local_1d48;
  do {
    local_2f20 = local_2f20 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x1094d0);
  } while (local_2f20 != local_1d70);
  std::__cxx11::string::~string(local_1c88);
  std::__cxx11::string::~string(local_1ca8);
  std::__cxx11::string::~string(local_1cc8);
  std::__cxx11::string::~string(local_1c60);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e70,"int",&local_1e71);
  std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffcb38 >> 0x20));
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffcafc,in_stack_ffffffffffffcaf8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffcafc,in_stack_ffffffffffffcaf8),
                 (char *)CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  local_1f88 = (undefined1 **)local_1f80;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffcb20,(char *)in_stack_ffffffffffffcb18);
  local_1f58 = (undefined1 **)local_1f80;
  local_1f50 = 1;
  in_12._M_array._4_4_ = in_stack_ffffffffffffcb2c;
  in_12._M_array._0_4_ = in_stack_ffffffffffffcb28;
  in_12._M_len = (size_type)in_stack_ffffffffffffcb30;
  args::Matcher::Matcher(in_stack_ffffffffffffcb20,in_12);
  local_1f8c = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)in_stack_ffffffffffffcb30,
             (Group *)CONCAT44(in_stack_ffffffffffffcb2c,in_stack_ffffffffffffcb28),
             (string *)in_stack_ffffffffffffcb20,(string *)in_stack_ffffffffffffcb18,
             in_stack_ffffffffffffcb10,
             (int *)CONCAT44(in_stack_ffffffffffffcb0c,in_stack_ffffffffffffcb08),
             SUB41((uint)in_stack_ffffffffffffcb04 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  local_2f40 = &local_1f58;
  do {
    local_2f40 = local_2f40 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x109699);
    iVar2 = (int)((ulong)in_stack_ffffffffffffcb38 >> 0x20);
  } while (local_2f40 != local_1f80);
  std::__cxx11::string::~string(local_1e98);
  std::__cxx11::string::~string(local_1eb8);
  std::__cxx11::string::~string(local_1ed8);
  std::__cxx11::string::~string(local_1e70);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2080,"int",&local_2081);
  std::__cxx11::to_string(iVar2);
  std::operator+((char *)CONCAT44(in_stack_ffffffffffffcafc,in_stack_ffffffffffffcaf8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffcafc,in_stack_ffffffffffffcaf8),
                 (char *)CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  local_2198 = (undefined1 **)local_2190;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffcb20,(char *)in_stack_ffffffffffffcb18);
  local_2168 = (undefined1 **)local_2190;
  local_2160 = 1;
  in_13._M_array._4_4_ = in_stack_ffffffffffffcb2c;
  in_13._M_array._0_4_ = in_stack_ffffffffffffcb28;
  in_13._M_len = (size_type)in_stack_ffffffffffffcb30;
  args::Matcher::Matcher(in_stack_ffffffffffffcb20,in_13);
  local_219c = 0;
  args::ValueFlag<int,_args::ValueReader<int>_>::ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)in_stack_ffffffffffffcb30,
             (Group *)CONCAT44(in_stack_ffffffffffffcb2c,in_stack_ffffffffffffcb28),
             (string *)in_stack_ffffffffffffcb20,(string *)in_stack_ffffffffffffcb18,
             in_stack_ffffffffffffcb10,
             (int *)CONCAT44(in_stack_ffffffffffffcb0c,in_stack_ffffffffffffcb08),
             SUB41((uint)in_stack_ffffffffffffcb04 >> 0x18,0));
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  local_2f60 = &local_2168;
  do {
    local_2f60 = local_2f60 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x109862);
    extraError_ = (undefined1)((uint)in_stack_ffffffffffffcafc >> 0x18);
  } while (local_2f60 != local_2190);
  std::__cxx11::string::~string(local_20a8);
  std::__cxx11::string::~string(local_20c8);
  std::__cxx11::string::~string(local_20e8);
  std::__cxx11::string::~string(local_2080);
  std::allocator<char>::~allocator((allocator<char> *)&local_2081);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2288,"bool",&local_2289);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_22b0,"Generate plot and save in file",&local_22b1);
  local_2368 = (undefined1 **)local_2360;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffcb20,(char *)in_stack_ffffffffffffcb18);
  local_2338 = (undefined1 **)local_2360;
  local_2330 = 1;
  in_14._M_array._4_4_ = in_stack_ffffffffffffcb2c;
  in_14._M_array._0_4_ = in_stack_ffffffffffffcb28;
  in_14._M_len = (size_type)in_stack_ffffffffffffcb30;
  args::Matcher::Matcher(in_stack_ffffffffffffcb20,in_14);
  args::Flag::Flag((Flag *)in_stack_ffffffffffffcb20,in_stack_ffffffffffffcb18,
                   (string *)in_stack_ffffffffffffcb10,
                   (string *)CONCAT44(in_stack_ffffffffffffcb0c,in_stack_ffffffffffffcb08),
                   (Matcher *)CONCAT44(in_stack_ffffffffffffcb04,in_stack_ffffffffffffcb00),
                   (bool)extraError_);
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  local_2f88 = &local_2338;
  do {
    local_2f88 = local_2f88 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x1099f3);
  } while (local_2f88 != local_2360);
  std::__cxx11::string::~string(local_22b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_22b1);
  std::__cxx11::string::~string(local_2288);
  std::allocator<char>::~allocator((allocator<char> *)&local_2289);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2478,"string",&local_2479);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_24a0,"File with the deposition matrix",&local_24a1);
  local_2558 = (undefined1 **)local_2550;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffcb20,(char *)in_stack_ffffffffffffcb18);
  local_2528 = (undefined1 **)local_2550;
  local_2520 = 1;
  in_15._M_array._4_4_ = in_stack_ffffffffffffcb2c;
  in_15._M_array._0_4_ = in_stack_ffffffffffffcb28;
  in_15._M_len = (size_type)in_stack_ffffffffffffcb30;
  args::Matcher::Matcher(in_stack_ffffffffffffcb20,in_15);
  std::__cxx11::string::string(local_2578);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::ValueFlag((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffcb30,
              (Group *)CONCAT44(in_stack_ffffffffffffcb2c,in_stack_ffffffffffffcb28),
              (string *)in_stack_ffffffffffffcb20,(string *)in_stack_ffffffffffffcb18,
              in_stack_ffffffffffffcb10,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT44(in_stack_ffffffffffffcb0c,in_stack_ffffffffffffcb08),
              SUB41((uint)in_stack_ffffffffffffcb04 >> 0x18,0));
  std::__cxx11::string::~string(local_2578);
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  local_2fb8 = &local_2528;
  do {
    local_2fb8 = local_2fb8 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x109ba7);
  } while (local_2fb8 != local_2550);
  std::__cxx11::string::~string(local_24a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_24a1);
  std::__cxx11::string::~string(local_2478);
  std::allocator<char>::~allocator((allocator<char> *)&local_2479);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2688,"string",&local_2689);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_26b0,"File with the beam coordinates",&local_26b1);
  local_2768 = (undefined1 **)local_2760;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffcb20,(char *)in_stack_ffffffffffffcb18);
  local_2738 = (undefined1 **)local_2760;
  local_2730 = 1;
  in_16._M_array._4_4_ = in_stack_ffffffffffffcb2c;
  in_16._M_array._0_4_ = in_stack_ffffffffffffcb28;
  in_16._M_len = (size_type)in_stack_ffffffffffffcb30;
  args::Matcher::Matcher(in_stack_ffffffffffffcb20,in_16);
  std::__cxx11::string::string(local_2788);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::ValueFlag((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffcb30,
              (Group *)CONCAT44(in_stack_ffffffffffffcb2c,in_stack_ffffffffffffcb28),
              (string *)in_stack_ffffffffffffcb20,(string *)in_stack_ffffffffffffcb18,
              in_stack_ffffffffffffcb10,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT44(in_stack_ffffffffffffcb0c,in_stack_ffffffffffffcb08),
              SUB41((uint)in_stack_ffffffffffffcb04 >> 0x18,0));
  std::__cxx11::string::~string(local_2788);
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  local_2fe8 = &local_2738;
  do {
    local_2fe8 = local_2fe8 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x109d5b);
  } while (local_2fe8 != local_2760);
  std::__cxx11::string::~string(local_26b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_26b1);
  std::__cxx11::string::~string(local_2688);
  std::allocator<char>::~allocator((allocator<char> *)&local_2689);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2898,"string",&local_2899);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_28c0,"Absolute path of the executable (if it is executed from other directory)",
             &local_28c1);
  local_2978 = (undefined1 **)local_2970;
  args::EitherFlag::EitherFlag
            ((EitherFlag *)in_stack_ffffffffffffcb20,(char *)in_stack_ffffffffffffcb18);
  local_2948 = (undefined1 **)local_2970;
  local_2940 = 1;
  in_17._M_array._4_4_ = in_stack_ffffffffffffcb2c;
  in_17._M_array._0_4_ = in_stack_ffffffffffffcb28;
  in_17._M_len = (size_type)in_stack_ffffffffffffcb30;
  args::Matcher::Matcher(in_stack_ffffffffffffcb20,in_17);
  std::__cxx11::string::string(local_2998);
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::ValueFlag((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_ffffffffffffcb30,
              (Group *)CONCAT44(in_stack_ffffffffffffcb2c,in_stack_ffffffffffffcb28),
              (string *)in_stack_ffffffffffffcb20,(string *)in_stack_ffffffffffffcb18,
              in_stack_ffffffffffffcb10,
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              CONCAT44(in_stack_ffffffffffffcb0c,in_stack_ffffffffffffcb08),
              SUB41((uint)in_stack_ffffffffffffcb04 >> 0x18,0));
  std::__cxx11::string::~string(local_2998);
  args::Matcher::~Matcher((Matcher *)CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0));
  local_3018 = &local_2948;
  do {
    local_3018 = local_3018 + -5;
    args::EitherFlag::~EitherFlag((EitherFlag *)0x109f0f);
    iVar2 = (int)((ulong)in_stack_ffffffffffffcb58 >> 0x20);
  } while (local_3018 != local_2970);
  std::__cxx11::string::~string(local_28c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_28c1);
  std::__cxx11::string::~string(local_2898);
  std::allocator<char>::~allocator((allocator<char> *)&local_2899);
  args::ArgumentParser::ParseCLI(in_stack_ffffffffffffcb60,iVar2,in_stack_ffffffffffffcb50);
  bVar1 = args::Base::operator_cast_to_bool((Base *)0x10c093);
  if (bVar1) {
    piVar7 = args::ValueFlag<int,_args::ValueReader<int>_>::Get(&local_580);
    local_18 = *piVar7;
  }
  bVar1 = args::Base::operator_cast_to_bool((Base *)0x10c0bc);
  if (bVar1) {
    piVar7 = args::ValueFlag<int,_args::ValueReader<int>_>::Get(&local_790);
    local_14 = *piVar7;
  }
  bVar1 = args::Base::operator_cast_to_bool((Base *)0x10c0e5);
  if (bVar1) {
    piVar7 = args::ValueFlag<int,_args::ValueReader<int>_>::Get(&local_9a0);
    local_40 = (double)*piVar7;
  }
  bVar1 = args::Base::operator_cast_to_bool((Base *)0x10c112);
  if (bVar1) {
    piVar7 = args::ValueFlag<int,_args::ValueReader<int>_>::Get(&local_bb0);
    local_48 = (double)*piVar7;
  }
  bVar1 = args::Base::operator_cast_to_bool((Base *)0x10c13f);
  if (bVar1) {
    pdVar5 = args::ValueFlag<double,_args::ValueReader<double>_>::Get(&local_dc8);
    local_30 = *pdVar5;
  }
  bVar1 = args::Base::operator_cast_to_bool((Base *)0x10c16c);
  if (bVar1) {
    pdVar5 = args::ValueFlag<double,_args::ValueReader<double>_>::Get(&local_fe0);
    local_38 = *pdVar5;
  }
  bVar1 = args::Base::operator_cast_to_bool((Base *)0x10c199);
  if (bVar1) {
    piVar7 = args::ValueFlag<int,_args::ValueReader<int>_>::Get(&local_11f0);
    local_1c = *piVar7;
  }
  bVar1 = args::Base::operator_cast_to_bool((Base *)0x10c1c2);
  if (bVar1) {
    piVar7 = args::ValueFlag<int,_args::ValueReader<int>_>::Get(&local_1400);
    local_20 = *piVar7;
  }
  bVar1 = args::Base::operator_cast_to_bool((Base *)0x10c1eb);
  if (bVar1) {
    piVar7 = args::ValueFlag<int,_args::ValueReader<int>_>::Get(&local_1820);
    local_24 = *piVar7;
  }
  bVar1 = args::Base::operator_cast_to_bool((Base *)0x10c214);
  if (bVar1) {
    piVar7 = args::ValueFlag<int,_args::ValueReader<int>_>::Get(&local_1a30);
    local_28 = *piVar7;
  }
  bVar1 = args::Base::operator_cast_to_bool((Base *)0x10c23d);
  if (bVar1) {
    puVar6 = (uint *)args::ValueFlag<int,_args::ValueReader<int>_>::Get(&local_1610);
    local_e0 = *puVar6;
  }
  bVar1 = args::Base::operator_cast_to_bool((Base *)0x10c266);
  if (bVar1) {
    piVar7 = args::ValueFlag<int,_args::ValueReader<int>_>::Get(&local_1c40);
    local_4c = *piVar7;
  }
  bVar1 = args::Base::operator_cast_to_bool((Base *)0x10c28f);
  if (bVar1) {
    piVar7 = args::ValueFlag<int,_args::ValueReader<int>_>::Get(&local_1e50);
    local_50 = *piVar7;
  }
  bVar1 = args::Base::operator_cast_to_bool((Base *)0x10c2b8);
  if (bVar1) {
    piVar7 = args::ValueFlag<int,_args::ValueReader<int>_>::Get(&local_2060);
    local_54 = *piVar7;
  }
  srand(local_e0);
  bVar1 = args::Base::operator_cast_to_bool((Base *)0x10c2ed);
  if (bVar1) {
    pbVar8 = args::
             ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::Get(&local_2458);
    std::__cxx11::string::operator=(local_78,(string *)pbVar8);
  }
  bVar1 = args::Base::operator_cast_to_bool((Base *)0x10c321);
  if (bVar1) {
    pbVar8 = args::
             ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::Get(&local_2668);
    std::__cxx11::string::operator=(local_b0,(string *)pbVar8);
  }
  bVar1 = args::Base::operator_cast_to_bool((Base *)0x10c355);
  if (bVar1) {
    pbVar8 = args::
             ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::Get(&local_2878);
    std::__cxx11::string::operator=(local_d8,(string *)pbVar8);
  }
  __path = (char *)std::__cxx11::string::c_str();
  chdir(__path);
  poVar9 = std::operator<<((ostream *)&std::cout,
                           "##**************************************************************************"
                          );
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  poVar9 = std::operator<<((ostream *)&std::cout,
                           "##**************************************************************************"
                          );
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  poVar9 = std::operator<<((ostream *)&std::cout,
                           "##******** IMRT-Solver (Ant Colony Optimization) *********");
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  poVar9 = std::operator<<((ostream *)&std::cout,
                           "##**************************************************************************"
                          );
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  poVar9 = std::operator<<((ostream *)&std::cout,
                           "##**************************************************************************"
                          );
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  local_29f8 = 0x3ff0000000000000;
  uStack_29f0 = 0x3ff0000000000000;
  local_29e8 = 0x3ff0000000000000;
  local_29e0 = &local_29f8;
  local_29d8 = 3;
  std::allocator<double>::allocator((allocator<double> *)0x10c4e2);
  __l._M_array._4_4_ = in_stack_ffffffffffffcb2c;
  __l._M_array._0_4_ = in_stack_ffffffffffffcb28;
  __l._M_len = (size_type)in_stack_ffffffffffffcb30;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffcb20,__l,
             (allocator_type *)in_stack_ffffffffffffcb18);
  std::allocator<double>::~allocator((allocator<double> *)0x10c516);
  local_2a38 = 0x4053000000000000;
  local_2a48 = 0;
  uStack_2a40 = 0;
  local_2a28 = &local_2a48;
  local_2a20 = 3;
  std::allocator<double>::allocator((allocator<double> *)0x10c568);
  __l_00._M_array._4_4_ = in_stack_ffffffffffffcb2c;
  __l_00._M_array._0_4_ = in_stack_ffffffffffffcb28;
  __l_00._M_len = (size_type)in_stack_ffffffffffffcb30;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffcb20,__l_00,
             (allocator_type *)in_stack_ffffffffffffcb18);
  std::allocator<double>::~allocator((allocator<double> *)0x10c59c);
  local_2a88 = 0x408f400000000000;
  local_2a98 = 0x4050400000000000;
  uStack_2a90 = 0x404e000000000000;
  local_2a78 = &local_2a98;
  local_2a70 = 3;
  std::allocator<double>::allocator((allocator<double> *)0x10c5ee);
  __l_01._M_array._4_4_ = in_stack_ffffffffffffcb2c;
  __l_01._M_array._0_4_ = in_stack_ffffffffffffcb28;
  __l_01._M_len = (size_type)in_stack_ffffffffffffcb30;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffcb20,__l_01,
             (allocator_type *)in_stack_ffffffffffffcb18);
  std::allocator<double>::~allocator((allocator<double> *)0x10c622);
  std::__cxx11::string::string(local_2c78,local_b0);
  std::__cxx11::string::string(local_2cc8,local_78);
  get_angles(in_stack_ffffffffffffce48,in_stack_ffffffffffffce44);
  imrt::Collimator::Collimator
            (in_stack_ffffffffffffced0,in_stack_ffffffffffffcec8,in_stack_ffffffffffffcec0);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x10c698);
  std::__cxx11::string::~string(local_2cc8);
  std::__cxx11::string::~string(local_2c78);
  std::__cxx11::string::string(local_2d00,local_78);
  createVolumes(in_stack_ffffffffffffce18,in_stack_ffffffffffffce10);
  std::__cxx11::string::~string(local_2d00);
  poVar9 = std::operator<<((ostream *)&std::cout,"##");
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  poVar9 = std::operator<<((ostream *)&std::cout,
                           "##**************************************************************************"
                          );
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  poVar9 = std::operator<<((ostream *)&std::cout,
                           "##*********************************** INFO *********************************"
                          );
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  poVar9 = std::operator<<((ostream *)&std::cout,
                           "##**************************************************************************"
                          );
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  poVar9 = std::operator<<((ostream *)&std::cout,"##");
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  poVar9 = std::operator<<(poVar9,"## Solver: ");
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  poVar9 = std::operator<<((ostream *)&std::cout,"##   Iterations: ");
  pvVar10 = (void *)std::ostream::operator<<(poVar9,local_1c);
  std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
  poVar9 = std::operator<<((ostream *)&std::cout,"##   Time: ");
  pvVar10 = (void *)std::ostream::operator<<(poVar9,local_20);
  std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
  poVar9 = std::operator<<((ostream *)&std::cout,"##   Seed: ");
  pvVar10 = (void *)std::ostream::operator<<(poVar9,local_e0);
  std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
  poVar9 = std::operator<<((ostream *)&std::cout,"##   alpha: ");
  pvVar10 = (void *)std::ostream::operator<<(poVar9,local_30);
  std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
  poVar9 = std::operator<<((ostream *)&std::cout,"##   Initial intensity: ");
  pvVar10 = (void *)std::ostream::operator<<(poVar9,local_4c);
  std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
  poVar9 = std::operator<<((ostream *)&std::cout,"##   Max intensity: ");
  pvVar10 = (void *)std::ostream::operator<<(poVar9,local_50);
  std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
  poVar9 = std::operator<<((ostream *)&std::cout,"##   Step intensity: ");
  pvVar11 = (void *)std::ostream::operator<<(poVar9,local_54);
  std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
  poVar12 = std::operator<<((ostream *)&std::cout,"##");
  poVar13 = (ostream *)std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
  poVar14 = std::operator<<(poVar13,"## Colimator configuration: ");
  std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
  this = (ACS *)std::operator<<((ostream *)&std::cout,"##   Stations: ");
  iVar2 = imrt::Collimator::getNbAngles(&local_2c58);
  Zmin_00 = (vector<double,_std::allocator<double>_> *)std::ostream::operator<<(this,iVar2);
  std::ostream::operator<<(Zmin_00,std::endl<char,std::char_traits<char>>);
  std::operator<<((ostream *)&std::cout,"##   Angles: ");
  local_2d04 = 0;
  while( true ) {
    iVar19 = local_2d04;
    iVar3 = imrt::Collimator::getNbAngles(&local_2c58);
    _n_ants = (int)pvVar10;
    step_intensity_00 = (int)poVar9;
    initial_intensity_00 = (int)pvVar11;
    max_intensity_00 = (int)poVar12;
    max_apertures_00 = (int)poVar13;
    if (iVar3 <= iVar19) break;
    in_stack_ffffffffffffcba4 =
         imrt::Collimator::getAngle
                   ((Collimator *)CONCAT44(in_stack_ffffffffffffcaf4,in_stack_ffffffffffffcaf0),
                    in_stack_ffffffffffffcaec);
    in_stack_ffffffffffffcb98 =
         (ostream *)std::ostream::operator<<(&std::cout,in_stack_ffffffffffffcba4);
    std::operator<<(in_stack_ffffffffffffcb98," ");
    local_2d04 = local_2d04 + 1;
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar9 = std::operator<<((ostream *)&std::cout,"##   Apertures: ");
  pvVar10 = (void *)std::ostream::operator<<(poVar9,local_24);
  std::ostream::operator<<(pvVar10,std::endl<char,std::char_traits<char>>);
  poVar12 = std::operator<<((ostream *)&std::cout,"##");
  poVar13 = (ostream *)std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
  poVar14 = std::operator<<(poVar13,"## Instance information: ");
  std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
  poVar14 = std::operator<<((ostream *)&std::cout,"##   Volumes: ");
  sVar15 = std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::size(&local_2ce0);
  pvVar11 = (void *)std::ostream::operator<<(poVar14,sVar15);
  std::ostream::operator<<(pvVar11,std::endl<char,std::char_traits<char>>);
  poVar14 = std::operator<<((ostream *)&std::cout,"##");
  poVar14 = (ostream *)std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
  poVar14 = std::operator<<(poVar14,
                            "##**************************************************************************"
                           );
  std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
  poVar14 = std::operator<<((ostream *)&std::cout,
                            "##********************************** SEARCH ********************************"
                           );
  std::ostream::operator<<(poVar14,std::endl<char,std::char_traits<char>>);
  __x = std::operator<<((ostream *)&std::cout,
                        "##**************************************************************************"
                       );
  std::ostream::operator<<(__x,std::endl<char,std::char_traits<char>>);
  imrt::Collimator::generateReference(in_stack_ffffffffffffcb30);
  imrt::Collimator::generateIntensityLevels
            (in_stack_ffffffffffffcb30,in_stack_ffffffffffffcb2c,in_stack_ffffffffffffcb28);
  plVar16 = (long *)operator_new(0x118);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)poVar14,
             (vector<double,_std::allocator<double>_> *)__x);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)poVar14,
             (vector<double,_std::allocator<double>_> *)__x);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)poVar14,
             (vector<double,_std::allocator<double>_> *)__x);
  iVar17 = local_50;
  iVar18 = local_54;
  imrt::ACS::ACS(this,(vector<double,_std::allocator<double>_> *)
                      CONCAT44(iVar2,in_stack_ffffffffffffcbb8),Zmin_00,
                 (vector<double,_std::allocator<double>_> *)CONCAT44(iVar3,iVar19),
                 (Collimator *)CONCAT44(in_stack_ffffffffffffcba4,in_stack_ffffffffffffcba0),
                 (vector<imrt::Volume,_std::allocator<imrt::Volume>_> *)in_stack_ffffffffffffcb98,
                 max_apertures_00,max_intensity_00,initial_intensity_00,step_intensity_00,_n_ants,
                 (double)poVar9,(double)pvVar10,(double)poVar12,(double)poVar13);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_ffffffffffffcb04,iVar18));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_ffffffffffffcb04,iVar18));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_ffffffffffffcb04,iVar18));
  (**(code **)(*plVar16 + 0x20))(plVar16,900);
  poVar9 = std::operator<<((ostream *)&std::cout,
                           "##**************************************************************************"
                          );
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  poVar9 = std::operator<<((ostream *)&std::cout,
                           "##******************************* RESULTS **********************************"
                          );
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  poVar9 = std::operator<<((ostream *)&std::cout,
                           "##**************************************************************************"
                          );
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  poVar9 = std::operator<<((ostream *)&std::cout,"##");
  std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
  local_4 = 0;
  local_29a4 = 1;
  std::vector<imrt::Volume,_std::allocator<imrt::Volume>_>::~vector
            ((vector<imrt::Volume,_std::allocator<imrt::Volume>_> *)
             CONCAT44(in_stack_ffffffffffffcb04,iVar18));
  imrt::Collimator::~Collimator((Collimator *)CONCAT44(in_stack_ffffffffffffcaf4,iVar17));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_ffffffffffffcb04,iVar18));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_ffffffffffffcb04,iVar18));
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)CONCAT44(in_stack_ffffffffffffcb04,iVar18));
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~ValueFlag((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffcaf4,iVar17));
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~ValueFlag((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffcaf4,iVar17));
  args::
  ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~ValueFlag((ValueFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_args::ValueReader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT44(in_stack_ffffffffffffcaf4,iVar17));
  args::Flag::~Flag((Flag *)0x10d2af);
  args::ValueFlag<int,_args::ValueReader<int>_>::~ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)0x10d2bc);
  args::ValueFlag<int,_args::ValueReader<int>_>::~ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)0x10d2c9);
  args::ValueFlag<int,_args::ValueReader<int>_>::~ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)0x10d2d6);
  args::ValueFlag<int,_args::ValueReader<int>_>::~ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)0x10d2e3);
  args::ValueFlag<int,_args::ValueReader<int>_>::~ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)0x10d2f0);
  args::ValueFlag<int,_args::ValueReader<int>_>::~ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)0x10d2fd);
  args::ValueFlag<int,_args::ValueReader<int>_>::~ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)0x10d30a);
  args::ValueFlag<int,_args::ValueReader<int>_>::~ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)0x10d317);
  args::ValueFlag<double,_args::ValueReader<double>_>::~ValueFlag
            ((ValueFlag<double,_args::ValueReader<double>_> *)0x10d324);
  args::ValueFlag<double,_args::ValueReader<double>_>::~ValueFlag
            ((ValueFlag<double,_args::ValueReader<double>_> *)0x10d331);
  args::ValueFlag<int,_args::ValueReader<int>_>::~ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)0x10d33e);
  args::ValueFlag<int,_args::ValueReader<int>_>::~ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)0x10d34b);
  args::ValueFlag<int,_args::ValueReader<int>_>::~ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)0x10d358);
  args::ValueFlag<int,_args::ValueReader<int>_>::~ValueFlag
            ((ValueFlag<int,_args::ValueReader<int>_> *)0x10d365);
  args::HelpFlag::~HelpFlag((HelpFlag *)0x10d372);
  args::ArgumentParser::~ArgumentParser
            ((ArgumentParser *)CONCAT44(in_stack_ffffffffffffcaf4,iVar17));
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_b0);
  std::__cxx11::string::~string(local_78);
  return local_4;
}

Assistant:

int main(int argc, char** argv){

  int vsize=50;
  int bsize=20;
  int maxiter=5000;
  int maxtime=0;
  int max_apertures=5;
  int open_apertures=-1;
  double alpha=1.0;
  double beta=1.0;
  double maxdelta=5.0;
  double maxratio=3.0;

  //bool search_aperture=false;
  //bool search_intensity=false;
  //string strategy="dao_ls";
  //int ls_type=ApertureILS::FIRST_IMPROVEMENT;

  int initial_intensity=2;
  int max_intensity=28;
  int step_intensity=2;
  
  //bool acceptance=ILS::ACCEPT_NONE;
  //int initial_setup;

  // ls params
  //double prob_intensity=0.2;
  //double temperature, initial_temperature=10;
  //double min_temperature=0;
  //double alphaT=0.95;
  //int perturbation=2;

  string file="data/testinstance_0_70_140_210_280.txt";
  string file2="data/test_instance_coordinates.txt";
  string path=".";
  int seed=time(NULL);

  // Tabu list <<beam,station*>, open> for intensity
  //vector<pair<pair<int,Station*>,  bool > > tabu_list_inten;
  // Tabu list <<beam,station*>, <aperture,open>> for aperture
  //vector<pair<pair<int,Station*>, pair<int, bool> > > tabu_list_aper;
  //int tabusize=10;


  args::ArgumentParser parser("********* IMRT-Solver (ACO solver) *********", "Example.\n./ACO -s ibo_ls --maxiter=400 --maxdelta=8 --maxratio=6 --alpha=0.999 --beta=0.999 --bsize=5 --vsize=20 --max-apertures=4 --seed=0 --open-apertures=1 --initial-intensity=4 --step-intensity=1 --file-dep=data/Equidistantes/equidist00.txt --file-coord=data/Equidistantes/equidist-coord.txt");
  args::HelpFlag help(parser, "help", "Display this help menu", {'h', "help"});
  //args::ValueFlag<string> _format(parser, "string", "Format: (BR, BRw, 1C)", {'f'});
  //args::ValueFlag<string> _strategy(parser, "string", "Strategy  (dao_ls|ibo_ls)", {'s', "strategy"});
  args::ValueFlag<int> _bsize(parser, "int", "Number of considered beamlets for selection ("+to_string(bsize)+")", {"bsize"});
  args::ValueFlag<int> _vsize(parser, "int", "Number of considered worst voxels ("+to_string(vsize)+")", {"vsize"});
  // args::ValueFlag<int> _int0(parser, "int", "Initial intensity for beams  ("+to_string(int0)+")", {"int0"});
  args::ValueFlag<int> _maxdelta(parser, "int", "Max delta  ("+to_string(maxdelta)+")", {"maxdelta"});
  args::ValueFlag<int> _maxratio(parser, "int", "Max ratio  ("+to_string(maxratio)+")", {"maxratio"});
  args::ValueFlag<double> _alpha(parser, "double", "Initial temperature for intensities  ("+to_string(alpha)+")", {"alpha"});
  args::ValueFlag<double> _beta(parser, "double", "Initial temperature for ratio  ("+to_string(beta)+")", {"beta"});
  args::ValueFlag<int> _maxiter(parser, "int", "Number of iterations ("+to_string(maxiter)+")", {"maxiter"});
  args::ValueFlag<int> _maxtime(parser, "int", "Maximum time in seconds ("+to_string(maxtime)+")", {"maxtime"});
  args::ValueFlag<int> _seed(parser, "int", "Seed  ("+to_string(seed)+")", {"seed"});

  args::ValueFlag<int> _max_apertures(parser, "int", "Initial intensity for the station  ("+to_string(max_apertures)+")", {"max-apertures"});
  args::ValueFlag<int> _open_apertures(parser, "int", "Number of initialized open apertures (-1: all, default:"+to_string(open_apertures)+")", {"open-apertures"});
  args::ValueFlag<int> _initial_intensity(parser, "int", "Initial value aperture intensity  ("+to_string(initial_intensity)+")", {"initial-intensity"});
  args::ValueFlag<int> _max_intensity(parser, "int", "Max value aperture intensity  ("+to_string(max_intensity)+")", {"max-intensity"});
  args::ValueFlag<int> _step_intensity(parser, "int", "Step size for aperture intensity  ("+to_string(step_intensity)+")", {"step-intensity"});

  //args::Group setup (parser, "Initial solution setup (these override all provided configurations):", args::Group::Validators::DontCare);
  //args::Flag open_max(setup, "open_max", "Open aperture setup with max intensity", {"open-max-setup"});
  //args::Flag open_min(setup, "open_min", "Open aperture setup with min intensity", {"open-min-setup"});
  //args::Flag closed_min(setup, "closed_min", "Closed aperture setup with min intensity", {"closed-min-setup"});
  //args::Flag closed_max(setup, "closed_max", "Closed aperture setup with max intensity", {"closed-max-setup"});
  //args::Flag all_rand(setup, "all_rand", "Random aperture setup with random intensity", {"rand-setup"});

  //args::Group dao_ls (parser, "Direct aperture local search:", args::Group::Validators::DontCare);
  //args::Flag ls_aperture(dao_ls, "ls_apertures", "Apply aperture local search", {"ls-aperture"});
  //args::Flag ls_intensity(dao_ls, "ls_intensity", "Apply intensity local search", {"ls-intensity"});
  //args::ValueFlag<double> _prob_intensity(dao_ls, "double", "Probability to search over intensity  ("+to_string(prob_intensity)+")", {"prob-intensity"});
  //args::Flag best_improv(dao_ls, "best_improv", "Apply best improvement when searching intensity or apertures", {"best-improvement"});
  //args::Flag first_improv(dao_ls, "first_improv", "Apply first improvement when searching intensity or apertures", {"first-improvement"});
  //args::Flag do_perturbate(dao_ls, "do_perturbate", "Perturbate after a selected criterion is triggered", {"perturbate"});

  //args::Group accept (parser, "Acceptance criterion:", args::Group::Validators::AtMostOne);
  //args::Flag accept_best(accept, "accept-best", "Accept only improvement", {"accept-best"});
  //args::Flag accept_sa(accept, "accept-sa", "Accept as simulated annealing", {"accept-sa"});

  //args::ValueFlag<double> _temperature(parser, "double", "Temperature for acceptance criterion  ("+to_string(temperature)+")", {"temperature"});
  //args::ValueFlag<double> _alphaT(parser, "double", "Reduction rate of the temperature  ("+to_string(alphaT)+")", {"alphaT"});
  //args::ValueFlag<int> _perturbation(parser, "int", "Perturbation size  ("+to_string(perturbation)+")", {"perturbation-size"});

  args::Flag _plot(parser, "bool", "Generate plot and save in file", {"plot"});
  //args::Flag trace(parser, "trace", "Trace", {"trace"});
  args::ValueFlag<string> _file(parser, "string", "File with the deposition matrix", {"file-dep"});
  args::ValueFlag<string> _file2(parser, "string", "File with the beam coordinates", {"file-coord"});
  args::ValueFlag<string> _path(parser, "string", "Absolute path of the executable (if it is executed from other directory)", {"path"});

	try
	{
		parser.ParseCLI(argc, argv);

	}
	catch (args::Help&)
	{
		std::cout << parser;
		return 0;
	}
	catch (args::ParseError& e)
	{
		std::cerr << e.what() << std::endl;
		std::cerr << parser;
		return 1;
	}
	catch (args::ValidationError& e)
	{
		std::cerr << e.what() << std::endl;
		std::cerr << parser;
		return 1;
	}

  //if(_strategy) strategy=_strategy.Get();
  if(_bsize) bsize=_bsize.Get();
  if(_vsize) vsize=_vsize.Get();
  if(_maxdelta) maxdelta=_maxdelta.Get();
  if(_maxratio) maxratio=_maxratio.Get();
  if(_alpha) alpha=_alpha.Get();
  if(_beta) beta=_beta.Get();
  if(_maxiter) maxiter=_maxiter.Get();
  if(_maxtime) maxtime=_maxtime.Get();
  if(_max_apertures) max_apertures=_max_apertures.Get();
  if(_open_apertures) open_apertures=_open_apertures.Get();
  if(_seed) seed=_seed.Get();
  if(_initial_intensity) initial_intensity=_initial_intensity.Get();
  if(_max_intensity) max_intensity=_max_intensity.Get();
  if(_step_intensity) step_intensity=_step_intensity.Get();
  //if(_prob_intensity) prob_intensity=_prob_intensity.Get();
  //if(_temperature) temperature=initial_temperature=_temperature.Get();
  //if(_alphaT) alphaT=_alphaT.Get();
  //if (ls_aperture) search_aperture=true;
  //if (ls_intensity) search_intensity=true;
  //if(!ls_aperture && !ls_intensity){
  //  search_aperture=true;
  //  search_intensity=true;
  //}
  //if (first_improv) ls_type=ApertureILS::FIRST_IMPROVEMENT;
  //if (best_improv) ls_type=ApertureILS::BEST_IMPROVEMENT;
  //if (accept_sa) acceptance=ILS::ACCEPT_SA;
  //if (accept_best) acceptance=ILS::ACCEPT_NONE;
  //if (_perturbation) perturbation=_perturbation.Get();

  srand(seed);

  //This should be at the end given that will modify values
  /*if(open_max) {
    initial_setup=Station::OPEN_MAX_SETUP;
    initial_intensity=max_intensity;
  } else if (open_min) {
    initial_setup=Station::OPEN_MIN_SETUP;
    initial_intensity=0;
  } else if (closed_min) {
    initial_setup=Station::CLOSED_MIN_SETUP;
    initial_intensity=0;
  } else if (closed_max) {
    initial_setup=Station::CLOSED_MAX_SETUP;
    initial_intensity=max_intensity;
  } else if (all_rand) {
    if(strategy=="dao_ls")
      initial_setup=Station::RAND_RAND_SETUP;
    else if (strategy=="ibo_ls")
      initial_setup=Station::RAND_INTENSITIES;
 }  else {
    initial_setup=Station::MANUAL_SETUP;
 }*/
    
  if (_file) file=_file.Get();
  if (_file2) file2=_file2.Get();
  if (_path) path=_path.Get();

  chdir(path.c_str());

  cout << "##**************************************************************************"<< endl;
  cout << "##**************************************************************************"<< endl;
  //if(strategy=="dao_ls")
    cout << "##******** IMRT-Solver (Ant Colony Optimization) *********"<< endl;
  //else if(strategy=="ibo_ls")
  //  cout << "##******** IMRT-Solver (Intensity-based Optimization Local Search) *********"<< endl;
  cout << "##**************************************************************************"<< endl;
  cout << "##**************************************************************************"<< endl;

  vector<double> w={1,1,1};
  vector<double> Zmin={0,0,76};
  vector<double> Zmax={65,60,1000};

  Collimator collimator(file2, get_angles(file, 5));
  vector<Volume> volumes= createVolumes (file, collimator);

  //Plan P(w, Zmin, Zmax, collimator, volumes, max_apertures, max_intensity, initial_intensity, step_intensity, open_apertures, initial_setup);

  //double best_eval=P.getEvaluation();

  cout << "##" << endl;
  cout << "##**************************************************************************"<< endl;
  cout << "##*********************************** INFO *********************************"<< endl;
  cout << "##**************************************************************************"<< endl;
  cout << "##" << endl << "## Solver: "<< endl;
  cout << "##   Iterations: " << maxiter << endl;
  cout << "##   Time: " << maxtime << endl;
  cout << "##   Seed: " << seed << endl;
  //cout << "##   Temperature: " << temperature << endl;
  cout << "##   alpha: " << alpha << endl;
  //if (search_aperture)
  //  cout << "##   Searching: aperture pattern" << endl;
  //if (search_intensity)
  //  cout << "##   Searching: intensity" << endl;
  //cout << "##   Probability intensity ls: " << prob_intensity << endl;
  //if (strategy=="dao_ls" && ls_type==ApertureILS::FIRST_IMPROVEMENT)
  //  cout << "##   Local search: first improvement"  << endl;
  //if (strategy=="dao_ls" && ls_type==ApertureILS::BEST_IMPROVEMENT)
  //  cout << "##   Local search: best improvement"  << endl;
  //cout << "##   Open initial setup: " ;
  //if (initial_setup==Station::OPEN_MAX_SETUP) cout << "open max intensity" << endl;
  //else if (initial_setup==Station::OPEN_MIN_SETUP) cout << "open min intensity" << endl;
  //else if (initial_setup==Station::CLOSED_MAX_SETUP) cout << "closed max intensity" << endl;
  //else if (initial_setup==Station::CLOSED_MIN_SETUP) cout << "closed min intensity" << endl;
  //else if (initial_setup==Station::RAND_RAND_SETUP) cout << "random" << endl;
  //else if (initial_setup==Station::RAND_INTENSITIES) cout << "random" << endl;
  //else cout << "manual, " << open_apertures << " open apertures" << endl;
  
  cout << "##   Initial intensity: " << initial_intensity << endl;
  cout << "##   Max intensity: " << max_intensity << endl;
  cout << "##   Step intensity: " << step_intensity << endl;
  //cout << "##   Perturbation size: " << perturbation << endl;
  
  cout << "##" << endl << "## Colimator configuration: "<< endl;
  cout << "##   Stations: " << collimator.getNbAngles() << endl;
  cout << "##   Angles: ";
  for (int i=0; i<collimator.getNbAngles();i++) cout << collimator.getAngle(i) << " ";
  cout << endl;
  cout << "##   Apertures: " << max_apertures << endl;


  cout << "##" << endl << "## Instance information: "<< endl;
  cout << "##   Volumes: " << volumes.size() << endl;

  cout << "##" << endl << "##**************************************************************************"<< endl;
  cout << "##********************************** SEARCH ********************************"<< endl;
  cout << "##**************************************************************************"<< endl;



  //cout << "## Initial solution: " << best_eval << endl;
  //cout  << "##" << endl;

  collimator.generateReference ();
  collimator.generateIntensityLevels (step_intensity,max_intensity);
  //collimator.printReference ();

  ACO* aco = new ACS(w, Zmin, Zmax, collimator, volumes, max_apertures, max_intensity, initial_intensity, step_intensity,10, 1, 2, 2, 0.2);
  aco->search(900);
  //aco->evaporation();
  //aco->printPheromone();
  //aco->printAnts();
  //aco->generateTours();
  //aco->printAnts();
  
  
  //if(strategy=="dao_ls")
   // ils = new ApertureILS(bsize, vsize, search_intensity, search_aperture,
   //                       prob_intensity, step_intensity, initial_temperature,
   //                       alphaT, do_perturbate, perturbation, acceptance, ls_type);
  //else if(strategy=="ibo_ls")
    //ils = new IntensityILS(step_intensity, bsize, vsize, maxdelta, maxratio, alpha, beta, perturbation);

  //ils-> notTargetedSearch(P, maxtime, maxiter);


  cout << "##**************************************************************************"<< endl;
  cout << "##******************************* RESULTS **********************************"<< endl;
  cout << "##**************************************************************************"<< endl;
  cout << "##"<<endl;
  
 // cout << "## Best solution found: " <<  P.getEvaluation() << endl;
  //cout <<  P.getEvaluation() << " ";

 /* const list<Station*> stations=P.get_stations();

  int tot_alpha=0;
  for(auto s:stations){
    int alpha=s->get_sum_alpha(strategy);
    cout << alpha << " " ;
    tot_alpha+=alpha;
  }
  cout << tot_alpha << " ";

  int nb_apertures=0;
  for(auto s:stations){
    int ap=s->get_nb_apertures(strategy);
    cout << ap << " " ;
    nb_apertures+=ap;
  }
  cout << nb_apertures << endl;*/


	/*cout << endl;
	for(int i=0;i<5;i++)
		P.printIntensity(i);

	cout << endl;
  */

/*
	cout << "********   Summary of the results    *********"<< endl;
	best_eval = F.eval(P,w,Zmin,Zmax);
	cout << "Final solution: " << best_eval << endl << endl;

  F.generate_voxel_dose_functions ();
  */
  /*set<int> l = get_angles(file, 5);
  if(_plot){
	  std::stringstream ss;
	  ss << "python plotter/plot.py " << *l.begin()/5 << "_" << strategy << "_" << initial_intensity << "_" << initial_setup << "_" << maxtime << "_" << seed <<".pdf";
	  std::string s = ss.str();
	  system(s.c_str());
  }
*/
	return 0;

}